

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

HeapType __thiscall
wasm::TranslateToFuzzReader::getSuperType(TranslateToFuzzReader *this,HeapType type)

{
  bool bVar1;
  HeapType *pHVar2;
  value_type *pvVar3;
  undefined1 extraout_DL;
  _Storage<wasm::HeapType,_true> local_58;
  optional<wasm::HeapType> super;
  undefined1 local_38 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> supers;
  TranslateToFuzzReader *this_local;
  HeapType type_local;
  
  supers.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  this_local = (TranslateToFuzzReader *)type.id;
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_38);
  while( true ) {
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_38,
               (value_type *)&this_local);
    local_58 = (_Storage<wasm::HeapType,_true>)::wasm::HeapType::getSuperType();
    super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ = extraout_DL;
    bVar1 = std::optional::operator_cast_to_bool((optional *)&local_58._M_value);
    if (!bVar1) break;
    pHVar2 = std::optional<wasm::HeapType>::operator*
                       ((optional<wasm::HeapType> *)&local_58._M_value);
    this_local = (TranslateToFuzzReader *)pHVar2->id;
  }
  pvVar3 = pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                     (this,(vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_38);
  type_local.id = pvVar3->id;
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_38);
  return (HeapType)type_local.id;
}

Assistant:

HeapType TranslateToFuzzReader::getSuperType(HeapType type) {
  // TODO cache these?
  std::vector<HeapType> supers;
  while (1) {
    supers.push_back(type);
    if (auto super = type.getSuperType()) {
      type = *super;
    } else {
      break;
    }
  }
  return pick(supers);
}